

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O3

void __thiscall JsrtRuntime::EnsureJsrtDebugManager(JsrtRuntime *this)

{
  HeapAllocator *alloc;
  JsrtDebugManager *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->jsrtDebugManager == (JsrtDebugManager *)0x0) {
    local_48 = (undefined1  [8])&JsrtDebugManager::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_555b90;
    data.filename._0_4_ = 0xc4;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_00 = (JsrtDebugManager *)new<Memory::HeapAllocator>(0x68,alloc,0x2ff150);
    JsrtDebugManager::JsrtDebugManager(this_00,this->threadContext);
    this->jsrtDebugManager = this_00;
  }
  return;
}

Assistant:

void JsrtRuntime::EnsureJsrtDebugManager()
{
    if (this->jsrtDebugManager == nullptr)
    {
        this->jsrtDebugManager = HeapNew(JsrtDebugManager, this->threadContext);
    }
    Assert(this->jsrtDebugManager != nullptr);
}